

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableMultiplicationGeneralizationImpl.hpp
# Opt level: O3

int __thiscall
Inferences::VariableMultiplicationGeneralizationImpl::Preprocess::joinRegions
          (Preprocess *this,int v,int w)

{
  VariableRegion *pVVar1;
  int iVar2;
  VariableRegion local_70;
  VariableRegion local_4c;
  
  iVar2 = v;
  if (v != w) {
    Lib::IntUnionFind::doUnion(this->components,v,w);
    iVar2 = Lib::IntUnionFind::root(this->components,v);
    pVVar1 = this->varRegions->_stack;
    Lib::CoproductImpl::TrivialOperations::MoveCons::
    DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
    ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
                   *)&local_4c,
                  (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
                   *)(pVVar1 + w));
    VariableRegion::meet(&local_70,pVVar1 + v,&local_4c);
    Lib::CoproductImpl::TrivialOperations::MoveCons::
    DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
    ::operator=((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
                 *)(this->varRegions->_stack + iVar2),
                (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
                 *)&local_70);
    Lib::CoproductImpl::
    RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>::
    switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>>::~DefaultImpl()::_lambda(auto:1)_1_>
              ((RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>
                *)&local_70,(anon_class_8_1_8991fb9c)&local_70);
    Lib::CoproductImpl::
    RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>::
    switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>>::~DefaultImpl()::_lambda(auto:1)_1_>
              ((RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>
                *)&local_4c,(anon_class_8_1_8991fb9c)&local_4c);
  }
  return iVar2;
}

Assistant:

int joinRegions(int v, int w)
  {
    if (v == w) return v;

    components.doUnion(v,w);
    auto r = components.root(v);
    varSet(r) = std::move(varSet(v)).meet(std::move(varSet(w)));

    return r;
  }